

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathRunEval(xmlXPathParserContextPtr ctxt,int toBool)

{
  xmlPatternPtr comp;
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlXPathObjectPtr *ppxVar3;
  xmlXPathCompExprPtr pxVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  long lVar7;
  xmlXPathStepOpPtr op;
  xmlXPathObjectPtr resObj;
  
  if ((ctxt != (xmlXPathParserContextPtr)0x0) &&
     (pxVar4 = ctxt->comp, pxVar4 != (xmlXPathCompExprPtr)0x0)) {
    ctxt->context->depth = 0;
    if (ctxt->valueTab == (xmlXPathObjectPtr *)0x0) {
      ppxVar3 = (xmlXPathObjectPtr *)(*xmlMalloc)(0x50);
      ctxt->valueTab = ppxVar3;
      if (ppxVar3 == (xmlXPathObjectPtr *)0x0) {
        xmlXPathPErrMemory(ctxt,"creating evaluation context\n");
        (*xmlFree)(ctxt);
      }
      ctxt->valueNr = 0;
      ctxt->valueMax = 10;
      ctxt->value = (xmlXPathObjectPtr)0x0;
      ctxt->valueFrame = 0;
      pxVar4 = ctxt->comp;
    }
    comp = pxVar4->stream;
    if (comp != (xmlPatternPtr)0x0) {
      if (toBool == 0) {
        resObj = (xmlXPathObjectPtr)0x0;
        iVar2 = xmlXPathRunStreamEval(ctxt->context,comp,&resObj,0);
        if (resObj != (xmlXPathObjectPtr)0x0 && iVar2 != -1) {
          valuePush(ctxt,resObj);
          return 0;
        }
        if (resObj != (xmlXPathObjectPtr)0x0) {
          xmlXPathReleaseObject(ctxt->context,resObj);
        }
      }
      else {
        iVar2 = xmlXPathRunStreamEval(ctxt->context,comp,(xmlXPathObjectPtr *)0x0,1);
        if (iVar2 != -1) {
          return iVar2;
        }
      }
    }
    lVar7 = (long)ctxt->comp->last;
    if (-1 < lVar7) {
      op = ctxt->comp->steps + lVar7;
      if (toBool != 0) {
        iVar2 = xmlXPathCompOpEvalToBoolean(ctxt,op,0);
        return iVar2;
      }
      xmlXPathCompOpEval(ctxt,op);
      return 0;
    }
    pp_Var5 = __xmlGenericError();
    p_Var1 = *pp_Var5;
    ppvVar6 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar6,"xmlXPathRunEval: last is less than zero\n");
  }
  return -1;
}

Assistant:

static int
xmlXPathRunEval(xmlXPathParserContextPtr ctxt, int toBool)
{
    xmlXPathCompExprPtr comp;

    if ((ctxt == NULL) || (ctxt->comp == NULL))
	return(-1);

    ctxt->context->depth = 0;

    if (ctxt->valueTab == NULL) {
	/* Allocate the value stack */
	ctxt->valueTab = (xmlXPathObjectPtr *)
			 xmlMalloc(10 * sizeof(xmlXPathObjectPtr));
	if (ctxt->valueTab == NULL) {
	    xmlXPathPErrMemory(ctxt, "creating evaluation context\n");
	    xmlFree(ctxt);
	}
	ctxt->valueNr = 0;
	ctxt->valueMax = 10;
	ctxt->value = NULL;
        ctxt->valueFrame = 0;
    }
#ifdef XPATH_STREAMING
    if (ctxt->comp->stream) {
	int res;

	if (toBool) {
	    /*
	    * Evaluation to boolean result.
	    */
	    res = xmlXPathRunStreamEval(ctxt->context,
		ctxt->comp->stream, NULL, 1);
	    if (res != -1)
		return(res);
	} else {
	    xmlXPathObjectPtr resObj = NULL;

	    /*
	    * Evaluation to a sequence.
	    */
	    res = xmlXPathRunStreamEval(ctxt->context,
		ctxt->comp->stream, &resObj, 0);

	    if ((res != -1) && (resObj != NULL)) {
		valuePush(ctxt, resObj);
		return(0);
	    }
	    if (resObj != NULL)
		xmlXPathReleaseObject(ctxt->context, resObj);
	}
	/*
	* QUESTION TODO: This falls back to normal XPath evaluation
	* if res == -1. Is this intended?
	*/
    }
#endif
    comp = ctxt->comp;
    if (comp->last < 0) {
	xmlGenericError(xmlGenericErrorContext,
	    "xmlXPathRunEval: last is less than zero\n");
	return(-1);
    }
    if (toBool)
	return(xmlXPathCompOpEvalToBoolean(ctxt,
	    &comp->steps[comp->last], 0));
    else
	xmlXPathCompOpEval(ctxt, &comp->steps[comp->last]);

    return(0);
}